

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_nls.c
# Opt level: O0

int idaNlsLSolve(N_Vector delta,void *ida_mem)

{
  int iVar1;
  long in_RSI;
  undefined8 in_RDI;
  int retval;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RSI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x113,"idaNlsLSolve",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_nls.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    iVar1 = (**(code **)(in_RSI + 0x400))
                      (in_RSI,in_RDI,*(undefined8 *)(in_RSI + 0x180),*(undefined8 *)(in_RSI + 0x188)
                       ,*(undefined8 *)(in_RSI + 400),*(undefined8 *)(in_RSI + 0x1c0));
    if (iVar1 < 0) {
      local_4 = -7;
    }
    else if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

static int idaNlsLSolve(N_Vector delta, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  retval = IDA_mem->ida_lsolve(IDA_mem, delta, IDA_mem->ida_ewt, IDA_mem->ida_yy,
                               IDA_mem->ida_yp, IDA_mem->ida_savres);

  if (retval < 0) { return (IDA_LSOLVE_FAIL); }
  if (retval > 0) { return (IDA_LSOLVE_RECVR); }

  return (IDA_SUCCESS);
}